

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

Extension __thiscall spvtools::EnumSet<spvtools::Extension>::Iterator::operator*(Iterator *this)

{
  bool bVar1;
  Extension EVar2;
  const_reference bucket;
  Iterator *this_local;
  
  bVar1 = HasEnumAt(this->set_,this->bucketIndex_,(ulong)this->bucketOffset_);
  if (!bVar1) {
    __assert_fail("set_->HasEnumAt(bucketIndex_, bucketOffset_) && \"operator*() called on an invalid iterator.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x7f,
                  "T spvtools::EnumSet<spvtools::Extension>::Iterator::operator*() const [T = spvtools::Extension]"
                 );
  }
  bucket = std::
           vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ::operator[](&this->set_->buckets_,this->bucketIndex_);
  EVar2 = GetValueFromBucket(bucket,(ulong)this->bucketOffset_);
  return EVar2;
}

Assistant:

T operator*() const {
      assert(set_->HasEnumAt(bucketIndex_, bucketOffset_) &&
             "operator*() called on an invalid iterator.");
      return GetValueFromBucket(set_->buckets_[bucketIndex_], bucketOffset_);
    }